

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_free_extensions(nifti_image *nim)

{
  void *__ptr;
  nifti1_extension *pnVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (nim == (nifti_image *)0x0) {
    return -1;
  }
  uVar2 = (ulong)(uint)nim->num_ext;
  pnVar1 = nim->ext_list;
  if (nim->num_ext < 1) {
    if (pnVar1 != (nifti1_extension *)0x0 && 0 < g_opts_0) goto LAB_0010ef5d;
  }
  else if (pnVar1 == (nifti1_extension *)0x0) {
    if (g_opts_0 < 1) goto LAB_0010ef38;
    pnVar1 = (nifti1_extension *)0x0;
LAB_0010ef5d:
    fprintf(_stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",uVar2,pnVar1);
  }
  else {
    lVar4 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&nim->ext_list->esize + lVar4);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        uVar2 = (ulong)(uint)nim->num_ext;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < (int)uVar2);
    free(nim->ext_list);
  }
  if (2 < g_opts_0) {
    nifti_free_extensions_cold_1();
  }
LAB_0010ef38:
  nim->num_ext = 0;
  nim->ext_list = (nifti1_extension *)0x0;
  return 0;
}

Assistant:

int nifti_free_extensions( nifti_image *nim )
{
   int c ;
   if( nim == NULL ) return -1;
   if( nim->num_ext > 0 && nim->ext_list ){
      for( c = 0; c < nim->num_ext; c++ )
         if ( nim->ext_list[c].edata ) free(nim->ext_list[c].edata);
      free(nim->ext_list);
   }
   /* or if it is inconsistent, warn the user (if we are not in quiet mode) */
   else if ( (nim->num_ext > 0 || nim->ext_list != NULL) && (g_opts.debug > 0) )
      fprintf(stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",
              nim->num_ext, (void *)nim->ext_list);

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d free'd %d extension(s)\n", nim->num_ext);

   nim->num_ext = 0;
   nim->ext_list = NULL;

   return 0;
}